

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_exception.c
# Opt level: O1

exception exception_create_const(char *message,char *label,int64_t code,char *stacktrace)

{
  int iVar1;
  exception __ptr;
  size_t sVar2;
  char *pcVar3;
  uint64_t uVar4;
  
  __ptr = (exception)malloc(0x30);
  if (__ptr == (exception)0x0) {
    return (exception)0x0;
  }
  if (message == (char *)0x0) {
    __ptr->message = (char *)0x0;
  }
  else {
    sVar2 = strlen(message);
    pcVar3 = (char *)malloc(sVar2 + 1);
    __ptr->message = pcVar3;
    if (pcVar3 == (char *)0x0) {
      iVar1 = 3;
    }
    else {
      memcpy(pcVar3,message,sVar2 + 1);
      iVar1 = 0;
    }
    if (iVar1 != 0) {
      if (iVar1 != 3) {
        return __ptr;
      }
      goto LAB_0011e37f;
    }
  }
  if (label == (char *)0x0) {
    __ptr->label = (char *)0x0;
LAB_0011e320:
    if (stacktrace == (char *)0x0) {
      __ptr->stacktrace = (char *)0x0;
LAB_0011e38b:
      __ptr->code = code;
      uVar4 = thread_id_get_current();
      __ptr->id = uVar4;
      LOCK();
      (__ptr->ref).count = 0;
      UNLOCK();
      LOCK();
      exception_stats.allocations = exception_stats.allocations + 1;
      UNLOCK();
      return __ptr;
    }
    sVar2 = strlen(stacktrace);
    pcVar3 = (char *)malloc(sVar2 + 1);
    __ptr->stacktrace = pcVar3;
    if (pcVar3 == (char *)0x0) {
      iVar1 = 5;
    }
    else {
      memcpy(pcVar3,stacktrace,sVar2 + 1);
      iVar1 = 0;
    }
    if (iVar1 == 0) goto LAB_0011e38b;
    if (iVar1 != 5) {
      return __ptr;
    }
    free(__ptr->label);
  }
  else {
    sVar2 = strlen(label);
    pcVar3 = (char *)malloc(sVar2 + 1);
    __ptr->label = pcVar3;
    if (pcVar3 != (char *)0x0) {
      memcpy(pcVar3,label,sVar2 + 1);
      goto LAB_0011e320;
    }
  }
  free(__ptr->message);
LAB_0011e37f:
  free(__ptr);
  return (exception)0x0;
}

Assistant:

exception exception_create_const(const char *message, const char *label, int64_t code, const char *stacktrace)
{
	exception ex = malloc(sizeof(struct exception_type));

	if (ex == NULL)
	{
		goto exception_bad_alloc;
	}

	if (message != NULL)
	{
		size_t message_size = strlen(message) + 1;

		ex->message = malloc(sizeof(char) * message_size);

		if (ex->message == NULL)
		{
			goto message_bad_alloc;
		}

		memcpy(ex->message, message, message_size);
	}
	else
	{
		ex->message = NULL;
	}

	if (label != NULL)
	{
		size_t label_size = strlen(label) + 1;

		ex->label = malloc(sizeof(char) * label_size);

		if (ex->label == NULL)
		{
			goto label_bad_alloc;
		}

		memcpy(ex->label, label, label_size);
	}
	else
	{
		ex->label = NULL;
	}

	if (stacktrace != NULL)
	{
		size_t stacktrace_size = strlen(stacktrace) + 1;

		ex->stacktrace = malloc(sizeof(char) * stacktrace_size);

		if (ex->stacktrace == NULL)
		{
			goto stacktrace_bad_alloc;
		}

		memcpy(ex->stacktrace, stacktrace, stacktrace_size);
	}
	else
	{
		ex->stacktrace = NULL;
	}

	ex->code = code;
	ex->id = thread_id_get_current();

	threading_atomic_ref_count_initialize(&ex->ref);

	reflect_memory_tracker_allocation(exception_stats);

	return ex;

stacktrace_bad_alloc:
	free(ex->label);
label_bad_alloc:
	free(ex->message);
message_bad_alloc:
	free(ex);
exception_bad_alloc:
	return NULL;
}